

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_groupby.cpp
# Opt level: O2

void duckdb::CheckGroupingSetMax(idx_t count)

{
  ParserException *this;
  allocator local_39;
  string local_38;
  
  if (count < 0x10000) {
    return;
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Maximum grouping set count of %d exceeded",&local_39);
  ParserException::ParserException<unsigned_long>(this,&local_38,0xffff);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CheckGroupingSetMax(idx_t count) {
	static constexpr const idx_t MAX_GROUPING_SETS = 65535;
	if (count > MAX_GROUPING_SETS) {
		throw ParserException("Maximum grouping set count of %d exceeded", MAX_GROUPING_SETS);
	}
}